

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int menu;
  Shop shop;
  int local_6c;
  Shop local_68;
  
  system("COLOR 0");
  local_68.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_68.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_68.medicineList.super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_68.medicineList.super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.medicineList.super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Shop::initMedicineList(&local_68);
  do {
    system("cls");
    std::operator<<((ostream *)&std::cout,"Please chose an option: \n \n");
    std::operator<<((ostream *)&std::cout,"\t1. Add New Sale \t\n");
    std::operator<<((ostream *)&std::cout,"\t2. View All Medicine \t\n");
    std::operator<<((ostream *)&std::cout,"\t3. Sold Medicines List \t\n");
    std::operator<<((ostream *)&std::cout,"\t4. Add New Medicines\t\n");
    std::operator<<((ostream *)&std::cout,"\t5. Update Medicine Details \t\n");
    std::operator<<((ostream *)&std::cout,"\t6. Delete Medicine From Stock \t\n");
    std::operator<<((ostream *)&std::cout,"\t7. Total Sales Report\t\n\n");
    std::operator<<((ostream *)&std::cout,"Enter your choice: ");
    std::istream::operator>>((istream *)&std::cin,&local_6c);
    switch(local_6c) {
    case 1:
      Shop::addNewSale(&local_68);
      break;
    case 2:
      Shop::printMedicines(&local_68);
      break;
    case 3:
      Shop::soldMedicinesList(&local_68);
      break;
    case 4:
      Shop::addNewMedicine(&local_68);
      break;
    case 5:
      Shop::updateMedicineDetails(&local_68);
      break;
    case 6:
      Shop::deleteMedicineFromStock(&local_68);
      break;
    case 7:
      Shop::totalSalesReport(&local_68);
      break;
    default:
      poVar1 = std::operator<<((ostream *)&std::cout,"You enter invalid input\nre-enter the input\n"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_001024a7;
    }
    system("PAUSE");
LAB_001024a7:
    if (local_6c == 7) {
      Shop::~Shop(&local_68);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    system("COLOR 0");
    Shop shop;
    shop.initMedicineList();
    int menu;
    do {
        system("cls");
        cout << "Please chose an option: \n \n";

        cout << "\t1. Add New Sale \t\n";
        cout << "\t2. View All Medicine \t\n";
        cout << "\t3. Sold Medicines List \t\n";
        cout << "\t4. Add New Medicines\t\n";
        cout << "\t5. Update Medicine Details \t\n";
        cout << "\t6. Delete Medicine From Stock \t\n";
        cout << "\t7. Total Sales Report\t\n\n";
        cout << "Enter your choice: ";

        cin >> menu;

        switch (menu) {
            case 1: {
                shop.addNewSale();
                system("PAUSE");
                break;
            }

            case 2: {
                shop.printMedicines();
                system("PAUSE");
                break;
            }

            case 3: {
                shop.soldMedicinesList();
                system("PAUSE");
                break;
            }

            case 4: {
                shop.addNewMedicine();
                system("PAUSE");
                break;
            }
            case 5: {
                shop.updateMedicineDetails();
                system("PAUSE");
                break;
            }
            case 6: {
                shop.deleteMedicineFromStock();
                system("PAUSE");
                break;
            }
            case 7: {
                shop.totalSalesReport();
                system("PAUSE");
                break;
            }
            default: {
                cout << "You enter invalid input\nre-enter the input\n" << endl;
                break;
            }
        }
    } while (menu != 7);
    return 0;
}